

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O1

void do_shifts(TCGContext_conflict9 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_i32 s,
              TCGOpcode opc_s,TCGOpcode opc_v)

{
  TCGv_i32 pTVar1;
  uint uVar2;
  int iVar3;
  TCGOp *pTVar4;
  TCGv_vec b;
  TCGTemp *ts;
  TCGType_conflict type;
  uintptr_t o;
  TCGArg ai;
  uintptr_t o_1;
  uintptr_t o_2;
  
  pTVar1 = s + (long)&tcg_ctx->pool_cur;
  uVar2 = *(uint *)(r + (long)&tcg_ctx->pool_cur);
  type = uVar2 >> 0x10 & 0xff;
  iVar3 = tcg_can_emit_vec_op_tricore(tcg_ctx,opc_s,type,vece);
  if (iVar3 < 1) {
    if (-1 < iVar3) {
      b = tcg_temp_new_vec_tricore(tcg_ctx,type);
      if (vece == 3) {
        ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
        tcg_gen_extu_i32_i64_tricore(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),s);
        uVar2 = *(uint *)(b + (long)&tcg_ctx->pool_cur);
        pTVar4 = tcg_emit_op_tricore(tcg_ctx,INDEX_op_dup_vec);
        *(uint *)pTVar4 = (*(uint *)pTVar4 & 0xffff00ff) + ((uVar2 >> 8) + 0xe00 & 0xf00) + 0x3000;
        pTVar4->args[0] = (TCGArg)(b + (long)&tcg_ctx->pool_cur);
        pTVar4->args[1] = (TCGArg)ts;
        tcg_temp_free_internal_tricore(tcg_ctx,ts);
      }
      else {
        uVar2 = *(uint *)(b + (long)&tcg_ctx->pool_cur);
        pTVar4 = tcg_emit_op_tricore(tcg_ctx,INDEX_op_dup_vec);
        *(uint *)pTVar4 =
             (vece & 0xf) << 0xc | *(uint *)pTVar4 & 0xffff00ff | (uVar2 >> 8) + 0xe00 & 0xf00;
        pTVar4->args[0] = (TCGArg)(b + (long)&tcg_ctx->pool_cur);
        pTVar4->args[1] = (TCGArg)pTVar1;
      }
      do_op3(tcg_ctx,vece,r,a,b,opc_v);
      tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(b + (long)tcg_ctx));
      return;
    }
    tcg_expand_vec_op_tricore
              (tcg_ctx,opc_s,type,vece,(TCGArg)(r + (long)&tcg_ctx->pool_cur),
               a + (long)&tcg_ctx->pool_cur,pTVar1);
  }
  else {
    pTVar4 = tcg_emit_op_tricore(tcg_ctx,opc_s);
    pTVar4->field_0x1 =
         (byte)((vece << 0xc) >> 8) | (byte)((uVar2 >> 0x10) * 0x100 + 0xe00 >> 8) & 0xf;
    pTVar4->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
    pTVar4->args[1] = (TCGArg)(a + (long)&tcg_ctx->pool_cur);
    pTVar4->args[2] = (TCGArg)pTVar1;
  }
  return;
}

Assistant:

static void do_shifts(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a,
                      TCGv_i32 s, TCGOpcode opc_s, TCGOpcode opc_v)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGTemp *st = tcgv_i32_temp(tcg_ctx, s);
    TCGArg ri = temp_arg(rt);
    TCGArg ai = temp_arg(at);
    TCGArg si = temp_arg(st);
    TCGType type = rt->base_type;
    const TCGOpcode *hold_list;
    int can;

    tcg_debug_assert(at->base_type >= type);
    tcg_assert_listed_vecop(opc_s);
    hold_list = tcg_swap_vecop_list(NULL);

    can = tcg_can_emit_vec_op(tcg_ctx, opc_s, type, vece);
    if (can > 0) {
        vec_gen_3(tcg_ctx, opc_s, type, vece, ri, ai, si);
    } else if (can < 0) {
        tcg_expand_vec_op(tcg_ctx, opc_s, type, vece, ri, ai, si);
    } else {
        TCGv_vec vec_s = tcg_temp_new_vec(tcg_ctx, type);

        if (vece == MO_64) {
            TCGv_i64 s64 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_extu_i32_i64(tcg_ctx, s64, s);
            tcg_gen_dup_i64_vec(tcg_ctx, MO_64, vec_s, s64);
            tcg_temp_free_i64(tcg_ctx, s64);
        } else {
            tcg_gen_dup_i32_vec(tcg_ctx, vece, vec_s, s);
        }
        do_op3_nofail(tcg_ctx, vece, r, a, vec_s, opc_v);
        tcg_temp_free_vec(tcg_ctx, vec_s);
    }
    tcg_swap_vecop_list(hold_list);
}